

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_csv_state.cpp
# Opt level: O1

void __thiscall
duckdb::CSVGlobalState::CSVGlobalState
          (CSVGlobalState *this,ClientContext *context_p,CSVReaderOptions *options,
          idx_t total_file_count,MultiFileBindData *bind_data)

{
  pointer pcVar1;
  DatabaseInstance *this_00;
  idx_t iVar2;
  byte bVar3;
  byte bVar4;
  
  (this->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState =
       (_func_int **)&PTR__CSVGlobalState_024a2610;
  this->context = context_p;
  this->bind_data = bind_data;
  (this->sniffer_mismatch_error)._M_dataplus._M_p = (pointer)&(this->sniffer_mismatch_error).field_2
  ;
  pcVar1 = (options->sniffer_user_mismatch_error)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->sniffer_mismatch_error,pcVar1,
             pcVar1 + (options->sniffer_user_mismatch_error)._M_string_length);
  this->initialized = false;
  this->single_threaded = false;
  (this->current_buffer_in_use).internal.
  super___shared_ptr<duckdb::CSVBufferUsage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->current_buffer_in_use).internal.
  super___shared_ptr<duckdb::CSVBufferUsage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CSVIterator::CSVIterator(&this->current_boundary);
  (this->rejects_file_indexes).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->rejects_file_indexes).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->rejects_file_indexes).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_00 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&this->context->db);
  iVar2 = DatabaseInstance::NumberOfThreads(this_00);
  bVar3 = options->parallel ^ 1;
  bVar4 = 1;
  if (total_file_count <= iVar2 * 2) {
    bVar4 = bVar3;
  }
  if (total_file_count < 2) {
    bVar4 = bVar3;
  }
  this->single_threaded = (bool)bVar4;
  LOCK();
  (this->scanner_idx).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  this->initialized = false;
  return;
}

Assistant:

CSVGlobalState::CSVGlobalState(ClientContext &context_p, const CSVReaderOptions &options, idx_t total_file_count,
                               const MultiFileBindData &bind_data)
    : context(context_p), bind_data(bind_data), sniffer_mismatch_error(options.sniffer_user_mismatch_error) {
	// There are situations where we only support single threaded scanning
	auto system_threads = context.db->NumberOfThreads();
	bool many_csv_files = total_file_count > 1 && total_file_count > system_threads * 2;
	single_threaded = many_csv_files || !options.parallel;
	scanner_idx = 0;
	initialized = false;
}